

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

bool __thiscall LTFlightData::CreateAircraft(LTFlightData *this,double simTime)

{
  bool bVar1;
  logLevelTy lVar2;
  size_type sVar3;
  reference this_00;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  LTAircraft *pLVar8;
  char *pcVar9;
  LTFlightData *in_RDI;
  double in_XMM0_Qa;
  positionTy *in_stack_000000d0;
  dequePositionTy *in_stack_000000d8;
  system_error *e;
  exception *e_1;
  string sPosDeque;
  lock_guard<std::recursive_mutex> lock;
  LTFlightData *in_stack_00000998;
  LTAircraft *in_stack_000009a0;
  double in_stack_00000e50;
  LTFlightData *in_stack_00000e58;
  mutex_type *in_stack_fffffffffffffeb8;
  deque<positionTy,_std::allocator<positionTy>_> *in_stack_fffffffffffffec0;
  LTFlightData *in_stack_ffffffffffffff88;
  double in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar10;
  byte local_1;
  
  bVar1 = hasAc(in_RDI);
  if (bVar1) {
    local_1 = 1;
  }
  else {
    bVar1 = AcSlotAvailable((LTFlightData *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar1) {
      std::lock_guard<std::recursive_mutex>::lock_guard
                ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
      bVar1 = CalcNextPos(in_stack_00000e58,in_stack_00000e50);
      if (bVar1) {
        while( true ) {
          sVar3 = std::deque<positionTy,_std::allocator<positionTy>_>::size
                            ((deque<positionTy,_std::allocator<positionTy>_> *)0x1dffe5);
          bVar1 = false;
          if (1 < sVar3) {
            this_00 = std::deque<positionTy,_std::allocator<positionTy>_>::operator[]
                                (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
            in_stack_ffffffffffffff88 = (LTFlightData *)positionTy::ts(this_00);
            bVar1 = *(double *)&in_stack_ffffffffffffff88->acKey <= in_XMM0_Qa;
          }
          if (!bVar1) break;
          std::deque<positionTy,_std::allocator<positionTy>_>::pop_front(in_stack_fffffffffffffec0);
        }
        bVar1 = validForAcCreate((LTFlightData *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                 in_stack_ffffffffffffffb0);
        if (bVar1) {
          positionDeque2String_abi_cxx11_(in_stack_000000d8,in_stack_000000d0);
          DetermineAcModel(in_stack_ffffffffffffff88);
          uVar4 = std::__cxx11::string::empty();
          if (((uVar4 & 1) != 0) && (lVar2 = DataRefs::GetLogLevel(&dataRefs), (int)lVar2 < 3)) {
            key(in_RDI);
            pcVar9 = FDKeyTy::c_str((FDKeyTy *)0x1e0145);
            uVar5 = std::__cxx11::string::c_str();
            uVar6 = std::__cxx11::string::c_str();
            DataRefs::GetDefaultAcIcaoType_abi_cxx11_(&dataRefs);
            uVar7 = std::__cxx11::string::c_str();
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                   ,0xab1,"CreateAircraft",logWARN,
                   "Tracking data for \'%s\' (man \'%s\', mdl \'%s\') lacks ICAO a/c type code, can\'t derive type -> will be rendered with standard a/c %s"
                   ,pcVar9,uVar5,uVar6,uVar7);
          }
          pLVar8 = (LTAircraft *)operator_new(0x958);
          LTAircraft::LTAircraft(in_stack_000009a0,in_stack_00000998);
          in_RDI->pAc = pLVar8;
          if (in_RDI->pAc == (LTAircraft *)0x0) {
            lVar2 = DataRefs::GetLogLevel(&dataRefs);
            if ((int)lVar2 < 4) {
              key(in_RDI);
              pcVar9 = FDKeyTy::c_str((FDKeyTy *)0x1e0537);
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                     ,0xac5,"CreateAircraft",logERR,"Could not create new object (memory?): %s",
                     pcVar9);
            }
            local_1 = 0;
            iVar10 = 1;
          }
          else {
            iVar10 = 0;
          }
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
        }
        else {
          local_1 = 0;
          iVar10 = 1;
        }
      }
      else {
        local_1 = 0;
        iVar10 = 1;
      }
      std::lock_guard<std::recursive_mutex>::~lock_guard
                ((lock_guard<std::recursive_mutex> *)0x1e05a9);
      if (iVar10 == 0) {
        local_1 = 1;
      }
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool LTFlightData::CreateAircraft ( double simTime )
{
    // short-cut if exists already
    if ( hasAc() ) return true;
    
    // exit if too many a/c shown and this one wouldn't be one of the nearest ones
    if (!AcSlotAvailable())
        return false;
    
    try {
        // get the  mutex, not so much for protection,
        // but to speed up creation (which read-accesses lots of data and
        // thus makes many calls to the lock, which are now just quick recursive calls)
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);
        
        // make sure positional data is up-to-date
        // (also does a last validation...and now with lock, so that state is secured)
        if ( !CalcNextPos(simTime) )
            return false;
        
        // This can have change data in the posDeque...let's see if we are still valid for a/c create
        // Remove outdated positions from posDeque, ie. all positions before simTime
        while (posDeque.size() >= 2 && posDeque[1].ts() <= simTime)
            posDeque.pop_front();
        if ( !validForAcCreate(simTime) )
            return false;
        
        // There are yet unsolved errors where the subsequent aircraft creation failes with an
        // empty posDeque, though we just - while holding the dataAccessMutex - have verified
        // that we are valid for creation. See Issue #174.
        // Next time we see that bug we want to know what NOW is in posDeque:
        const std::string sPosDeque = positionDeque2String(posDeque);
        
        // Make sure we have a valid a/c model now
        DetermineAcModel();
        if (statData.acTypeIcao.empty()) {          // we don't...
            LOG_MSG(logWARN,ERR_NO_AC_TYPE,
                    key().c_str(),
                    statData.man.c_str(), statData.mdl.c_str(),
                    dataRefs.GetDefaultAcIcaoType().c_str());
        }

        // create the object (constructor will recursively re-access the lock)
        try {
            pAc = new LTAircraft(*this);
        } catch (const std::exception& e) {
            LOG_MSG(logERR, ERR_EXCEPTION_AC_CREATE,
                    key().c_str(), statData.acTypeIcao.c_str(),
                    e.what(), sPosDeque.c_str());
            pAc = nullptr;
        }
        catch(...) {
            LOG_MSG(logERR, ERR_UNKN_EXCP_AC_CREATE,
                    key().c_str(), statData.acTypeIcao.c_str(),
                    "<?>", sPosDeque.c_str());
            pAc = nullptr;
        }
        if (!pAc)
        {
            LOG_MSG(logERR,ERR_NEW_OBJECT,key().c_str());
            return false;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    // success
    return true;
}